

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O3

void swrenderer::R_EnterPortal(PortalDrawseg *pds,int depth)

{
  byte *pbVar1;
  double dVar2;
  short sVar3;
  short sVar4;
  line_t_conflict *src;
  vertex_t *pvVar5;
  line_t *plVar6;
  ushort uVar7;
  undefined8 uVar8;
  double dVar9;
  DAngle DVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  BYTE *pBVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  timespec ts;
  timespec local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  DVar10.Degrees = ViewAngle.Degrees;
  dVar9 = ViewPos.Z;
  uVar12 = DAT_0072ca4c;
  if (depth < r_portal_recursions.Value) {
    if (camera == (AActor *)0x0) {
      bVar18 = true;
    }
    else {
      bVar18 = ((camera->renderflags).Value & 0x8000) == 0;
    }
    local_68 = ViewPath[0].X;
    dStack_60 = ViewPath[0].Y;
    local_58 = ViewPath[0].Z;
    dStack_50 = ViewPath[1].X;
    local_78 = ViewPath[1].Y;
    dStack_70 = ViewPath[1].Z;
    CurrentPortalUniq = CurrentPortalUniq + 1;
    uVar13 = (ulong)DAT_0072ca4c;
    src = (line_t_conflict *)pds->src;
    local_48 = ViewPos.X;
    dStack_40 = ViewPos.Y;
    if (pds->mirror == true) {
      pvVar5 = src->v1;
      dVar2 = (src->delta).X;
      if (dVar2 == 0.0) {
        dVar24 = (pvVar5->p).X;
        ViewPos.X = (dVar24 + dVar24) - ViewPos.X;
        dVar24 = (src->delta).Y;
        uVar19 = SUB84(dVar24,0);
        uVar20 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      else {
        dVar24 = (src->delta).Y;
        uVar19 = SUB84(dVar24,0);
        uVar20 = (undefined4)((ulong)dVar24 >> 0x20);
        if (dVar24 == 0.0) {
          dVar24 = (pvVar5->p).Y;
          ViewPos.Y = (dVar24 + dVar24) - ViewPos.Y;
        }
        else {
          dVar24 = (pvVar5->p).X;
          dVar25 = (pvVar5->p).Y;
          dVar21 = (src->v2->p).X - dVar24;
          dVar22 = (src->v2->p).Y - dVar25;
          dVar23 = ((ViewPos.X - dVar24) * dVar21 + dVar22 * (ViewPos.Y - dVar25)) /
                   (dVar22 * dVar22 + dVar21 * dVar21);
          dVar24 = dVar23 * dVar21 + dVar24;
          dVar25 = dVar23 * dVar22 + dVar25;
          ViewPos.X = (dVar24 + dVar24) - ViewPos.X;
          ViewPos.Y = (dVar25 + dVar25) - ViewPos.Y;
        }
      }
      dVar2 = c_atan2((double)CONCAT44(uVar20,uVar19),dVar2);
      ViewAngle.Degrees = dVar2 * 114.59155902616465 - DVar10.Degrees;
    }
    else {
      P_TranslatePortalXY(src,&ViewPos.X,&ViewPos.Y);
      P_TranslatePortalZ((line_t_conflict *)pds->src,&ViewPos.Z);
      P_TranslatePortalAngle((line_t_conflict *)pds->src,&ViewAngle);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[0].X,&ViewPath[0].Y);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[1].X,&ViewPath[1].Y);
      if ((((r_showviewer == false) && (camera != (AActor *)0x0)) &&
          (plVar6 = pds->dst, dVar25 = (plVar6->delta).X, dVar21 = (plVar6->delta).Y,
          dVar2 = (plVar6->v1->p).X, dVar24 = (plVar6->v1->p).Y,
          1.52587890625e-05 < dVar25 * (ViewPath[0].Y - dVar24) + (dVar2 - ViewPath[0].X) * dVar21
          == dVar21 * (dVar2 - ViewPath[1].X) + (ViewPath[1].Y - dVar24) * dVar25 <=
             1.52587890625e-05)) &&
         (dVar2 = c_sqrt((ViewPath[0].Z - ViewPath[1].Z) * (ViewPath[0].Z - ViewPath[1].Z) +
                         (ViewPath[0].X - ViewPath[1].X) * (ViewPath[0].X - ViewPath[1].X) +
                         (ViewPath[0].Y - ViewPath[1].Y) * (ViewPath[0].Y - ViewPath[1].Y)),
         1.52587890625e-05 < dVar2)) {
        dVar24 = c_sqrt((ViewPos.Z - ViewPath[0].Z) * (ViewPos.Z - ViewPath[0].Z) +
                        (ViewPos.X - ViewPath[0].X) * (ViewPos.X - ViewPath[0].X) +
                        (ViewPos.Y - ViewPath[0].Y) * (ViewPos.Y - ViewPath[0].Y));
        dVar25 = c_sqrt((ViewPos.Z - ViewPath[1].Z) * (ViewPos.Z - ViewPath[1].Z) +
                        (ViewPos.X - ViewPath[1].X) * (ViewPos.X - ViewPath[1].X) +
                        (ViewPos.Y - ViewPath[1].Y) * (ViewPos.Y - ViewPath[1].Y));
        if (dVar25 + dVar24 < dVar2 + 1.0) {
          (camera->renderflags).Value = (camera->renderflags).Value | 0x8000;
        }
      }
    }
    ViewSin = FFastTrig::sin(&fasttrig,ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0);
    ViewCos = FFastTrig::cos(&fasttrig,ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0);
    uVar8 = CurrentPortal;
    ViewTanSin = ViewSin * FocalTangent;
    ViewTanCos = FocalTangent * ViewCos;
    stacked_viewpos._16_8_ = ViewPos.Z;
    stacked_viewpos._0_8_ = ViewPos.X;
    stacked_viewpos._8_8_ = ViewPos.Y;
    stacked_angle = ViewAngle.Degrees;
    stacked_extralight = extralight;
    validcount = validcount + 1;
    stacked_visibility = CurrentVisibility;
    CurrentPortal = pds;
    R_ClearPlanes(false);
    R_ClearClipSegs((short)pds->x1,(short)pds->x2);
    uVar7 = _MirrorFlags;
    WindowLeft = pds->x1;
    WindowRight = pds->x2;
    if (pds->mirror == true) {
      _MirrorFlags = _MirrorFlags ^ 1;
    }
    R_3D_EnterSkybox();
    CurrentPortalInSkybox = 0;
    memcpy(&ceilingclip + pds->x1,(pds->ceilingclip).Array,(long)pds->len * 2);
    memcpy(&floorclip + pds->x1,(pds->floorclip).Array,(long)pds->len * 2);
    InSubsector = 0;
    R_RenderBSPNode(nodes + (long)numnodes + -1);
    R_3D_ResetClip();
    if ((bool)(bVar18 & camera != (AActor *)0x0)) {
      pbVar1 = (byte *)((long)&(camera->renderflags).Value + 1);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    clock_gettime(1,&local_88);
    PlaneCycles.Sec =
         (double)local_88.tv_nsec * -1e-09 + (PlaneCycles.Sec - (double)local_88.tv_sec);
    R_DrawPlanes();
    R_DrawPortals();
    clock_gettime(1,&local_88);
    iVar15 = CurrentPortalUniq;
    PlaneCycles.Sec = (double)local_88.tv_sec + PlaneCycles.Sec + (double)local_88.tv_nsec * 1e-09;
    iVar11 = CurrentPortalUniq;
    if (uVar12 < DAT_0072ca4c) {
      lVar17 = uVar13 * 0x48;
      iVar16 = DAT_0072ca4c - uVar12;
      do {
        R_EnterPortal((PortalDrawseg *)(WallPortals + lVar17),depth + 1);
        lVar17 = lVar17 + 0x48;
        iVar16 = iVar16 + -1;
        iVar11 = CurrentPortalUniq;
      } while (iVar16 != 0);
    }
    CurrentPortalUniq = iVar15;
    NetUpdate();
    clock_gettime(1,&local_88);
    MaskedCycles.Sec =
         (double)local_88.tv_nsec * -1e-09 + (MaskedCycles.Sec - (double)local_88.tv_sec);
    R_DrawMasked();
    clock_gettime(1,&local_88);
    MaskedCycles.Sec = (double)local_88.tv_sec + MaskedCycles.Sec + (double)local_88.tv_nsec * 1e-09
    ;
    NetUpdate();
    R_3D_LeaveSkybox();
    CurrentPortalUniq = iVar11;
    if (r_highlight_portals.Value == true) {
      R_HighlightPortal(pds);
    }
    ViewPos.X = local_48;
    ViewPos.Y = dStack_40;
    ViewPath[0].X = local_68;
    ViewPath[0].Y = dStack_60;
    ViewPath[1].Y = local_78;
    ViewPath[1].Z = dStack_70;
    ViewPath[0].Z = local_58;
    ViewPath[1].X = dStack_50;
    _MirrorFlags = uVar7;
    CurrentPortal = (PortalDrawseg *)uVar8;
    ViewPos.Z = dVar9;
    ViewAngle.Degrees = DVar10.Degrees;
  }
  else {
    iVar11 = BestColor((uint32 *)&GPalette,0,0,0,0,0xff);
    uVar12 = pds->x1;
    iVar15 = pds->x2;
    if ((int)uVar12 < iVar15) {
      iVar16 = RenderTarget->Pitch;
      do {
        if ((-1 < (int)uVar12) && ((int)uVar12 < RenderTarget->Width)) {
          lVar17 = (long)(int)uVar12 - (long)pds->x1;
          sVar3 = (pds->ceilingclip).Array[lVar17];
          sVar4 = (pds->floorclip).Array[lVar17];
          if (sVar3 <= sVar4) {
            pBVar14 = RenderTarget->Buffer + (long)(iVar16 * sVar3) + (ulong)uVar12;
            iVar15 = ((int)sVar4 - (int)sVar3) + 1;
            do {
              *pBVar14 = (BYTE)iVar11;
              pBVar14 = pBVar14 + iVar16;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            iVar15 = pds->x2;
          }
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < iVar15);
    }
    if (r_highlight_portals.Value != false) {
      R_HighlightPortal(pds);
      return;
    }
  }
  return;
}

Assistant:

void R_EnterPortal (PortalDrawseg* pds, int depth)
{
	// [ZZ] check depth. fill portal with black if it's exceeding the visual recursion limit, and continue like nothing happened.
	if (depth >= r_portal_recursions)
	{
		BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 0, 0, 0, 0, 255);
		int spacing = RenderTarget->GetPitch();
		for (int x = pds->x1; x < pds->x2; x++)
		{
			if (x < 0 || x >= RenderTarget->GetWidth())
				continue;

			int Ytop = pds->ceilingclip[x-pds->x1];
			int Ybottom = pds->floorclip[x-pds->x1];

			BYTE *dest = RenderTarget->GetBuffer() + x + Ytop * spacing;

			for (int y = Ytop; y <= Ybottom; y++)
			{
				*dest = color;
				dest += spacing;
			}
		}

		if (r_highlight_portals)
			R_HighlightPortal(pds);

		return;
	}

	DAngle startang = ViewAngle;
	DVector3 startpos = ViewPos;
	DVector3 savedpath[2] = { ViewPath[0], ViewPath[1] };
	ActorRenderFlags savedvisibility = camera? camera->renderflags & RF_INVISIBLE : ActorRenderFlags::FromInt(0);

	CurrentPortalUniq++;

	unsigned int portalsAtStart = WallPortals.Size ();

	if (pds->mirror)
	{
		//vertex_t *v1 = ds->curline->v1;
		vertex_t *v1 = pds->src->v1;

		// Reflect the current view behind the mirror.
		if (pds->src->Delta().X == 0)
		{ // vertical mirror
			ViewPos.X = v1->fX() - startpos.X + v1->fX();
		}
		else if (pds->src->Delta().Y == 0)
		{ // horizontal mirror
			ViewPos.Y = v1->fY() - startpos.Y + v1->fY();
		}
		else
		{ // any mirror
			vertex_t *v2 = pds->src->v2;

			double dx = v2->fX() - v1->fX();
			double dy = v2->fY() - v1->fY();
			double x1 = v1->fX();
			double y1 = v1->fY();
			double x = startpos.X;
			double y = startpos.Y;

			// the above two cases catch len == 0
			double r = ((x - x1)*dx + (y - y1)*dy) / (dx*dx + dy*dy);

			ViewPos.X = (x1 + r * dx)*2 - x;
			ViewPos.Y = (y1 + r * dy)*2 - y;
		}
		ViewAngle = pds->src->Delta().Angle() * 2 - startang;
	}
	else
	{
		P_TranslatePortalXY(pds->src, ViewPos.X, ViewPos.Y);
		P_TranslatePortalZ(pds->src, ViewPos.Z);
		P_TranslatePortalAngle(pds->src, ViewAngle);
		P_TranslatePortalXY(pds->src, ViewPath[0].X, ViewPath[0].Y);
		P_TranslatePortalXY(pds->src, ViewPath[1].X, ViewPath[1].Y);

		if (!r_showviewer && camera && P_PointOnLineSidePrecise(ViewPath[0], pds->dst) != P_PointOnLineSidePrecise(ViewPath[1], pds->dst))
		{
			double distp = (ViewPath[0] - ViewPath[1]).Length();
			if (distp > EQUAL_EPSILON)
			{
				double dist1 = (ViewPos - ViewPath[0]).Length();
				double dist2 = (ViewPos - ViewPath[1]).Length();

				if (dist1 + dist2 < distp + 1)
				{
					camera->renderflags |= RF_INVISIBLE;
				}
			}
		}
	}

	ViewSin = ViewAngle.Sin();
	ViewCos = ViewAngle.Cos();

	ViewTanSin = FocalTangent * ViewSin;
	ViewTanCos = FocalTangent * ViewCos;

	R_CopyStackedViewParameters();

	validcount++;
	PortalDrawseg* prevpds = CurrentPortal;
	CurrentPortal = pds;

	R_ClearPlanes (false);
	R_ClearClipSegs (pds->x1, pds->x2);

	WindowLeft = pds->x1;
	WindowRight = pds->x2;
	
	// RF_XFLIP should be removed before calling the root function
	int prevmf = MirrorFlags;
	if (pds->mirror)
	{
		if (MirrorFlags & RF_XFLIP)
			MirrorFlags &= ~RF_XFLIP;
		else MirrorFlags |= RF_XFLIP;
	}

	// some portals have height differences, account for this here
	R_3D_EnterSkybox(); // push 3D floor height map
	CurrentPortalInSkybox = false; // first portal in a skybox should set this variable to false for proper clipping in skyboxes.

	// first pass, set clipping
	memcpy (ceilingclip + pds->x1, &pds->ceilingclip[0], pds->len*sizeof(*ceilingclip));
	memcpy (floorclip + pds->x1, &pds->floorclip[0], pds->len*sizeof(*floorclip));

	InSubsector = NULL;
	R_RenderBSPNode (nodes + numnodes - 1);
	R_3D_ResetClip(); // reset clips (floor/ceiling)
	if (!savedvisibility && camera) camera->renderflags &= ~RF_INVISIBLE;

	PlaneCycles.Clock();
	R_DrawPlanes ();
	R_DrawPortals ();
	PlaneCycles.Unclock();

	double vzp = ViewPos.Z;

	int prevuniq = CurrentPortalUniq;
	// depth check is in another place right now
	unsigned int portalsAtEnd = WallPortals.Size ();
	for (; portalsAtStart < portalsAtEnd; portalsAtStart++)
	{
		R_EnterPortal (&WallPortals[portalsAtStart], depth + 1);
	}
	int prevuniq2 = CurrentPortalUniq;
	CurrentPortalUniq = prevuniq;

	NetUpdate();

	MaskedCycles.Clock(); // [ZZ] count sprites in portals/mirrors along with normal ones.
	R_DrawMasked ();	  //      this is required since with portals there often will be cases when more than 80% of the view is inside a portal.
	MaskedCycles.Unclock();

	NetUpdate();

	R_3D_LeaveSkybox(); // pop 3D floor height map
	CurrentPortalUniq = prevuniq2;

	// draw a red line around a portal if it's being highlighted
	if (r_highlight_portals)
		R_HighlightPortal(pds);

	CurrentPortal = prevpds;
	MirrorFlags = prevmf;
	ViewAngle = startang;
	ViewPos = startpos;
	ViewPath[0] = savedpath[0];
	ViewPath[1] = savedpath[1];
}